

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootindexproxymodel.cpp
# Opt level: O0

void __thiscall
RootIndexProxyModelPrivate::onColumnsAboutToBeInserted
          (RootIndexProxyModelPrivate *this,QModelIndex *parent,int first,int last)

{
  QModelIndex childIdx;
  QModelIndex childIdx_00;
  RootIndexProxyModel *pRVar1;
  QModelIndex *this_00;
  bool bVar2;
  ulong uVar3;
  byte local_a9;
  undefined1 local_a0 [24];
  QModelIndex local_88;
  undefined8 local_70;
  quintptr local_68;
  QAbstractItemModel *local_60;
  QModelIndex local_58;
  QPersistentModelIndex local_40;
  undefined8 local_38;
  QAbstractItemModel *local_30;
  RootIndexProxyModel *local_28;
  RootIndexProxyModel *q;
  int last_local;
  int first_local;
  QModelIndex *parent_local;
  RootIndexProxyModelPrivate *this_local;
  
  q._0_4_ = last;
  q._4_4_ = first;
  _last_local = parent;
  parent_local = (QModelIndex *)this;
  local_28 = q_func(this);
  uVar3 = QPersistentModelIndex::isValid();
  if ((uVar3 & 1) != 0) {
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_40);
    childIdx.i = local_38;
    childIdx._0_8_ = local_40.d;
    childIdx.m = local_30;
    bVar2 = isDescendant(this,childIdx,_last_local);
    this_00 = _last_local;
    if (bVar2) {
      return;
    }
    QPersistentModelIndex::operator_cast_to_QModelIndex((QPersistentModelIndex *)&local_58);
    bVar2 = QModelIndex::operator!=(this_00,&local_58);
    local_a9 = 0;
    if (bVar2) {
      local_70._0_4_ = _last_local->r;
      local_70._4_4_ = _last_local->c;
      local_68 = _last_local->i;
      local_60 = _last_local->m;
      QPersistentModelIndex::operator_cast_to_QModelIndex((QPersistentModelIndex *)&local_88);
      childIdx_00.i = local_68;
      childIdx_00.r = (undefined4)local_70;
      childIdx_00.c = local_70._4_4_;
      childIdx_00.m = local_60;
      bVar2 = isDescendant(this,childIdx_00,&local_88);
      local_a9 = bVar2 ^ 0xff;
    }
    if ((local_a9 & 1) != 0) {
      return;
    }
  }
  pRVar1 = local_28;
  (**(code **)(*(long *)local_28 + 0x198))(local_a0,local_28,_last_local);
  QAbstractItemModel::beginInsertColumns((QModelIndex *)pRVar1,(int)local_a0,q._4_4_);
  return;
}

Assistant:

void RootIndexProxyModelPrivate::onColumnsAboutToBeInserted(const QModelIndex &parent, int first, int last)
{
    Q_Q(RootIndexProxyModel);
    Q_ASSERT(!parent.isValid() || parent.model() == q->sourceModel());
    if (m_rootIndex.isValid()) {
        if (isDescendant(m_rootIndex, parent))
            return;
        if (parent != m_rootIndex && !isDescendant(parent, m_rootIndex))
            return;
    }
    q->beginInsertColumns(q->mapFromSource(parent), first, last);
}